

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

bool __thiscall
google::anon_unknown_8::LogCleaner::IsLogFromCurrentProject
          (LogCleaner *this,string *filepath,string *base_filename,string *filename_extension)

{
  char cVar1;
  bool bVar2;
  __type_conflict _Var3;
  reference pcVar4;
  long lVar5;
  ulong uVar6;
  string *psVar7;
  long lVar8;
  char *pcVar9;
  char *c_1;
  size_t i;
  undefined1 local_b0 [8];
  string ext;
  char local_79;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_78;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  size_t real_filepath_size;
  char *dir_delim_end;
  string cleaned_base_filename;
  string *filename_extension_local;
  string *base_filename_local;
  string *filepath_local;
  LogCleaner *this_local;
  
  cleaned_base_filename.field_2._8_8_ = filename_extension;
  std::__cxx11::string::string((string *)&dir_delim_end);
  __range2 = (string *)std::__cxx11::string::size();
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_78._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff88), bVar2) {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    local_79 = *pcVar4;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pcVar9 = std::find<char_const*,char>
                         ("/N6google4base6LoggerE","N6google4base6LoggerE",&local_79);
      if (pcVar9 == "N6google4base6LoggerE") {
LAB_00115eea:
        std::__cxx11::string::operator+=((string *)&dir_delim_end,local_79);
      }
      else {
        uVar6 = std::__cxx11::string::empty();
        cVar1 = local_79;
        if ((uVar6 & 1) == 0) {
          std::__cxx11::string::size();
          pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)&dir_delim_end);
          if (cVar1 != *pcVar9) goto LAB_00115eea;
        }
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)&dir_delim_end,local_79);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  lVar5 = std::__cxx11::string::find((string *)filepath,(ulong)&dir_delim_end);
  if (lVar5 != 0) {
    this_local._7_1_ = 0;
    ext.field_2._8_4_ = 1;
    goto LAB_001162e8;
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    psVar7 = (string *)std::__cxx11::string::size();
    if (__range2 <= psVar7) {
      this_local._7_1_ = 0;
      ext.field_2._8_4_ = 1;
      goto LAB_001162e8;
    }
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_b0,(ulong)filepath);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)cleaned_base_filename.field_2._8_8_);
    if (_Var3) {
      std::__cxx11::string::operator+=
                ((string *)&dir_delim_end,(string *)cleaned_base_filename.field_2._8_8_);
LAB_001160a0:
      ext.field_2._8_4_ = 0;
    }
    else {
      psVar7 = (string *)std::__cxx11::string::size();
      if (psVar7 < __range2) {
        lVar5 = std::__cxx11::string::size();
        lVar8 = std::__cxx11::string::size();
        __range2 = (string *)(lVar5 - lVar8);
        std::__cxx11::string::substr((ulong)&i,(ulong)filepath);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&i,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)cleaned_base_filename.field_2._8_8_);
        std::__cxx11::string::~string((string *)&i);
        if (!bVar2) goto LAB_001160a0;
        this_local._7_1_ = 0;
        ext.field_2._8_4_ = 1;
      }
      else {
        this_local._7_1_ = 0;
        ext.field_2._8_4_ = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_b0);
    if (ext.field_2._8_4_ != 0) goto LAB_001162e8;
  }
  for (c_1 = (char *)std::__cxx11::string::size(); c_1 < __range2; c_1 = c_1 + 1) {
    pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)filepath);
    lVar5 = std::__cxx11::string::size();
    if ((char *)(lVar5 + 7U) < c_1) {
      lVar5 = std::__cxx11::string::size();
      if (c_1 == (char *)(lVar5 + 8)) {
        if (*pcVar9 != '-') {
          this_local._7_1_ = 0;
          ext.field_2._8_4_ = 1;
          goto LAB_001162e8;
        }
      }
      else {
        lVar5 = std::__cxx11::string::size();
        if ((char *)(lVar5 + 0xeU) < c_1) {
          lVar5 = std::__cxx11::string::size();
          if (c_1 == (char *)(lVar5 + 0xf)) {
            if (*pcVar9 != '.') {
              this_local._7_1_ = 0;
              ext.field_2._8_4_ = 1;
              goto LAB_001162e8;
            }
          }
          else {
            lVar5 = std::__cxx11::string::size();
            if (((char *)(lVar5 + 0x10U) <= c_1) && ((*pcVar9 < '0' || ('9' < *pcVar9)))) {
              this_local._7_1_ = 0;
              ext.field_2._8_4_ = 1;
              goto LAB_001162e8;
            }
          }
        }
        else if ((*pcVar9 < '0') || ('9' < *pcVar9)) {
          this_local._7_1_ = 0;
          ext.field_2._8_4_ = 1;
          goto LAB_001162e8;
        }
      }
    }
    else if ((*pcVar9 < '0') || ('9' < *pcVar9)) {
      this_local._7_1_ = 0;
      ext.field_2._8_4_ = 1;
      goto LAB_001162e8;
    }
  }
  this_local._7_1_ = 1;
  ext.field_2._8_4_ = 1;
LAB_001162e8:
  std::__cxx11::string::~string((string *)&dir_delim_end);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LogCleaner::IsLogFromCurrentProject(
    const string& filepath, const string& base_filename,
    const string& filename_extension) const {
  // We should remove duplicated delimiters from `base_filename`, e.g.,
  // before: "/tmp//<base_filename>.<create_time>.<pid>"
  // after:  "/tmp/<base_filename>.<create_time>.<pid>"
  string cleaned_base_filename;

  const char* const dir_delim_end =
      possible_dir_delim + sizeof(possible_dir_delim);

  size_t real_filepath_size = filepath.size();
  for (char c : base_filename) {
    if (cleaned_base_filename.empty()) {
      cleaned_base_filename += c;
    } else if (std::find(possible_dir_delim, dir_delim_end, c) ==
                   dir_delim_end ||
               (!cleaned_base_filename.empty() &&
                c != cleaned_base_filename[cleaned_base_filename.size() - 1])) {
      cleaned_base_filename += c;
    }
  }

  // Return early if the filename doesn't start with `cleaned_base_filename`.
  if (filepath.find(cleaned_base_filename) != 0) {
    return false;
  }

  // Check if in the string `filename_extension` is right next to
  // `cleaned_base_filename` in `filepath` if the user
  // has set a custom filename extension.
  if (!filename_extension.empty()) {
    if (cleaned_base_filename.size() >= real_filepath_size) {
      return false;
    }
    // for origin version, `filename_extension` is middle of the `filepath`.
    string ext = filepath.substr(cleaned_base_filename.size(),
                                 filename_extension.size());
    if (ext == filename_extension) {
      cleaned_base_filename += filename_extension;
    } else {
      // for new version, `filename_extension` is right of the `filepath`.
      if (filename_extension.size() >= real_filepath_size) {
        return false;
      }
      real_filepath_size = filepath.size() - filename_extension.size();
      if (filepath.substr(real_filepath_size) != filename_extension) {
        return false;
      }
    }
  }

  // The characters after `cleaned_base_filename` should match the format:
  // YYYYMMDD-HHMMSS.pid
  for (size_t i = cleaned_base_filename.size(); i < real_filepath_size; i++) {
    const char& c = filepath[i];

    if (i <= cleaned_base_filename.size() + 7) {  // 0 ~ 7 : YYYYMMDD
      if (c < '0' || c > '9') {
        return false;
      }

    } else if (i == cleaned_base_filename.size() + 8) {  // 8: -
      if (c != '-') {
        return false;
      }

    } else if (i <= cleaned_base_filename.size() + 14) {  // 9 ~ 14: HHMMSS
      if (c < '0' || c > '9') {
        return false;
      }

    } else if (i == cleaned_base_filename.size() + 15) {  // 15: .
      if (c != '.') {
        return false;
      }

    } else if (i >= cleaned_base_filename.size() + 16) {  // 16+: pid
      if (c < '0' || c > '9') {
        return false;
      }
    }
  }

  return true;
}